

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void blobGrowBuffer(Blob *pBlob,int nMin,int *pRc)

{
  char *pOld;
  int iVar1;
  char *nBytes;
  int nAlloc;
  
  if (*pRc != 0) {
    return;
  }
  if (pBlob->nAlloc < nMin) {
    pOld = pBlob->a;
    iVar1 = sqlite3_initialize();
    nBytes = (char *)0x0;
    if (iVar1 == 0) {
      if (0 < nMin) {
        nBytes = (char *)(ulong)(uint)nMin;
      }
      nBytes = (char *)sqlite3Realloc(pOld,(u64)nBytes);
    }
    if (nBytes == (char *)0x0) {
      *pRc = 7;
    }
    else {
      pBlob->nAlloc = nMin;
      pBlob->a = nBytes;
    }
  }
  return;
}

Assistant:

static void blobGrowBuffer(Blob *pBlob, int nMin, int *pRc){
  if( *pRc==SQLITE_OK && nMin>pBlob->nAlloc ){
    int nAlloc = nMin;
    char *a = (char *)sqlite3_realloc(pBlob->a, nAlloc);
    if( a ){
      pBlob->nAlloc = nAlloc;
      pBlob->a = a;
    }else{
      *pRc = SQLITE_NOMEM;
    }
  }
}